

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceMeanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducemean(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ReduceMeanLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_reducemean(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducemean(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ReduceMeanLayerParams>(arena);
    (this->layer_).reducemean_ = pRVar2;
  }
  return (ReduceMeanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMeanLayerParams* NeuralNetworkLayer::_internal_mutable_reducemean() {
  if (!_internal_has_reducemean()) {
    clear_layer();
    set_has_reducemean();
    layer_.reducemean_ = CreateMaybeMessage< ::CoreML::Specification::ReduceMeanLayerParams >(GetArenaForAllocation());
  }
  return layer_.reducemean_;
}